

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec10.c
# Opt level: O3

int If_CutPerformCheck10(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  uint uVar12;
  word pF [16];
  word local_b8 [17];
  
  if (nLeaves < 7) {
    return 1;
  }
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (0 < (int)uVar1) {
    memcpy(local_b8,pTruth,(ulong)uVar1 << 3);
  }
  iVar2 = nLeaves + -6;
  uVar12 = 1 << ((byte)iVar2 & 0x1f);
  uVar4 = 0;
  uVar1 = 0;
LAB_0039469c:
  if (uVar4 < 6) {
    if (iVar2 != 0x1f) {
      uVar6 = 1 << ((byte)uVar4 & 0x1f);
      uVar9 = 0;
      do {
        if ((local_b8[uVar9] & ~Truth6[uVar4]) !=
            (local_b8[uVar9] & Truth6[uVar4]) >> ((byte)uVar6 & 0x3f)) goto LAB_0039475c;
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
    }
  }
  else if (iVar2 != 0x1f) {
    bVar3 = (byte)(uVar4 - 6);
    uVar6 = 1 << (bVar3 & 0x1f);
    iVar7 = 2 << (bVar3 & 0x1f);
    uVar9 = 1;
    if (1 < (int)uVar6) {
      uVar9 = (ulong)uVar6;
    }
    pwVar10 = local_b8 + (int)uVar6;
    iVar5 = 0;
    pwVar11 = local_b8;
    do {
      if (uVar4 - 6 != 0x1f) {
        uVar8 = 0;
        do {
          if (pwVar11[uVar8] != pwVar10[uVar8]) {
            uVar6 = 1 << ((byte)uVar4 & 0x1f);
            goto LAB_0039475c;
          }
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      iVar5 = iVar5 + iVar7;
      pwVar10 = pwVar10 + iVar7;
      pwVar11 = pwVar11 + iVar7;
    } while (iVar5 < (int)uVar12);
  }
  goto LAB_00394762;
LAB_0039475c:
  uVar1 = uVar6 | uVar1;
LAB_00394762:
  uVar4 = uVar4 + 1;
  if (uVar4 == (uint)nLeaves) {
    if (uVar1 == 0) {
      return 0;
    }
    if ((uVar1 + 1 & uVar1) != 0) {
      return 0;
    }
    iVar2 = If_Dec10Perform(local_b8,nLeaves,(int)uVar4);
    return iVar2;
  }
  goto LAB_0039469c;
}

Assistant:

int If_CutPerformCheck10( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
	int nSupp, fDerive = 0;
    word pF[16];
    if ( nLeaves <= 6 )
        return 1;
    If_Dec10Copy( pF, (word *)pTruth, nVars );
    nSupp = If_Dec10Support( pF, nLeaves );
    if ( !nSupp || !If_DecSuppIsMinBase(nSupp) )
        return 0;
    if ( If_Dec10Perform( pF, nLeaves, fDerive ) )
    {
//        printf( "1" );
        return 1;
//        If_Dec10Verify( t, nLeaves, NULL );
    }
//    printf( "0" );
    return 0;
}